

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Progress.cxx
# Opt level: O1

void __thiscall Fl_Progress::Fl_Progress(Fl_Progress *this,int X,int Y,int W,int H,char *L)

{
  Fl_Widget::Fl_Widget(&this->super_Fl_Widget,X,Y,W,H,L);
  (this->super_Fl_Widget)._vptr_Fl_Widget = (_func_int **)&PTR__Fl_Widget_00278d50;
  (this->super_Fl_Widget).label_.align_ = 0x10;
  (this->super_Fl_Widget).box_ = '\x03';
  (this->super_Fl_Widget).color_ = 7;
  (this->super_Fl_Widget).color2_ = 0x5f;
  this->minimum_ = 0.0;
  Fl_Widget::redraw(&this->super_Fl_Widget);
  this->maximum_ = 100.0;
  Fl_Widget::redraw(&this->super_Fl_Widget);
  this->value_ = 0.0;
  Fl_Widget::redraw(&this->super_Fl_Widget);
  return;
}

Assistant:

Fl_Progress::Fl_Progress(int X, int Y, int W, int H, const char* L)
: Fl_Widget(X, Y, W, H, L) {
  align(FL_ALIGN_INSIDE);
  box(FL_DOWN_BOX);
  color(FL_BACKGROUND2_COLOR, FL_YELLOW);
  minimum(0.0f);
  maximum(100.0f);
  value(0.0f);
}